

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *type,Reader *replacement,
          UpgradeToStructMode upgradeToStructMode)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  ushort uVar5;
  long lVar6;
  Maybe<capnp::schema::Node::Reader> *matchSize;
  short sVar7;
  undefined2 uVar8;
  uint64_t structTypeId;
  int iVar9;
  short sVar10;
  Maybe<capnp::schema::Field::Reader> *matchPosition;
  CapTableReader *pCVar11;
  Fault f;
  StructReader local_180;
  StructReader local_150;
  PointerReader local_120;
  Maybe<capnp::schema::Field::Reader> local_100;
  Maybe<capnp::schema::Node::Reader> local_c8;
  Maybe<capnp::schema::Field::Reader> local_90;
  Maybe<capnp::schema::Node::Reader> local_58;
  
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x10) {
    sVar7 = 0;
  }
  else {
    sVar7 = *(replacement->_reader).data;
  }
  uVar2 = (type->_reader).dataSize;
  if (uVar2 < 0x10) {
    sVar10 = 0;
  }
  else {
    sVar10 = *(type->_reader).data;
  }
  if (sVar7 == sVar10) {
    if (uVar2 < 0x10) {
      uVar8 = 0;
    }
    else {
      uVar8 = *(type->_reader).data;
    }
    switch(uVar8) {
    case 0xe:
      iVar9 = 0x7fffffff;
      if ((type->_reader).pointerCount == 0) {
        local_150.capTable = (CapTableReader *)0x0;
        local_150.data = (WirePointer *)0x0;
        local_150.segment = (SegmentReader *)0x0;
        local_150.pointers._0_4_ = 0x7fffffff;
      }
      else {
        local_150.pointers._0_4_ = (type->_reader).nestingLimit;
        local_150.data = (type->_reader).pointers;
        local_150.segment = (type->_reader).segment;
        local_150.capTable = (type->_reader).capTable;
      }
      pCVar11 = (CapTableReader *)0x0;
      capnp::_::PointerReader::getStruct(&local_180,(PointerReader *)&local_150,(word *)0x0);
      local_120.pointer = (WirePointer *)0x0;
      local_120.segment = (SegmentReader *)0x0;
      if ((replacement->_reader).pointerCount != 0) {
        iVar9 = (replacement->_reader).nestingLimit;
        local_120.pointer = (replacement->_reader).pointers;
        local_120.segment = (replacement->_reader).segment;
        pCVar11 = (replacement->_reader).capTable;
      }
      local_120.capTable = pCVar11;
      local_120.nestingLimit = iVar9;
      capnp::_::PointerReader::getStruct(&local_150,&local_120,(word *)0x0);
      checkCompatibility(this,(Reader *)&local_180,(Reader *)&local_150,ALLOW_UPGRADE_TO_STRUCT);
      return;
    case 0xf:
      goto switchD_0021def5_caseD_f;
    case 0x10:
      if (uVar1 < 0x80) {
        lVar6 = 0;
      }
      else {
        lVar6 = *(long *)((long)(replacement->_reader).data + 8);
      }
      if (uVar2 < 0x80) {
        lVar4 = 0;
      }
      else {
        lVar4 = *(long *)((long)(type->_reader).data + 8);
      }
      if (lVar6 == lVar4) {
        return;
      }
      checkCompatibility(this);
      return;
    case 0x11:
      if (uVar1 < 0x80) {
        lVar6 = 0;
      }
      else {
        lVar6 = *(long *)((long)(replacement->_reader).data + 8);
      }
      if (uVar2 < 0x80) {
        lVar4 = 0;
      }
      else {
        lVar4 = *(long *)((long)(type->_reader).data + 8);
      }
      if (lVar6 == lVar4) {
        return;
      }
      checkCompatibility(this);
      return;
    default:
      return;
    }
  }
  if (((0xf < uVar1) && (*(replacement->_reader).data == 0xd)) &&
     (bVar3 = canUpgradeToData(this,type), bVar3)) {
LAB_0021de5a:
    replacementIsNewer(this);
    return;
  }
  if (((0xf < (type->_reader).dataSize) && (*(type->_reader).data == 0xd)) &&
     (bVar3 = canUpgradeToData(this,replacement), bVar3)) {
LAB_0021de8f:
    replacementIsOlder(this);
    return;
  }
  uVar1 = (replacement->_reader).dataSize;
  if ((0xf < uVar1) && (*(replacement->_reader).data == 0x12)) {
    if ((type->_reader).dataSize < 0x10) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(type->_reader).data;
    }
    if ((0xb < uVar5) && (uVar5 != 0xf)) goto LAB_0021de5a;
  }
  uVar2 = (type->_reader).dataSize;
  if ((0xf < uVar2) && (*(type->_reader).data == 0x12)) {
    if (uVar1 < 0x10) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(replacement->_reader).data;
    }
    if ((0xb < uVar5) && (uVar5 != 0xf)) goto LAB_0021de8f;
  }
  if (upgradeToStructMode == ALLOW_UPGRADE_TO_STRUCT) {
    if ((uVar2 < 0x10) || (*(type->_reader).data != 0x10)) {
      if ((uVar1 < 0x10) || (*(replacement->_reader).data != 0x10)) goto LAB_0021e015;
      if (uVar1 < 0x80) {
        structTypeId = 0;
      }
      else {
        structTypeId = *(uint64_t *)((long)(replacement->_reader).data + 8);
      }
      matchSize = &local_c8;
      local_c8.ptr.isSet = false;
      matchPosition = &local_100;
      local_100.ptr.isSet = false;
      replacement = type;
    }
    else {
      if (uVar2 < 0x80) {
        structTypeId = 0;
      }
      else {
        structTypeId = *(uint64_t *)((long)(type->_reader).data + 8);
      }
      matchSize = &local_58;
      local_58.ptr.isSet = false;
      matchPosition = &local_90;
      local_90.ptr.isSet = false;
    }
    checkUpgradeToStruct(this,replacement,structTypeId,matchSize,matchPosition);
  }
  else {
LAB_0021e015:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              ((Fault *)&local_180,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x3c9,FAILED,(char *)0x0,"\"a type was changed\"",
               (char (*) [19])"a type was changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault((Fault *)&local_180);
  }
  return;
switchD_0021def5_caseD_f:
  if (uVar1 < 0x80) {
    lVar6 = 0;
  }
  else {
    lVar6 = *(long *)((long)(replacement->_reader).data + 8);
  }
  if (uVar2 < 0x80) {
    lVar4 = 0;
  }
  else {
    lVar4 = *(long *)((long)(type->_reader).data + 8);
  }
  if (lVar6 == lVar4) {
    return;
  }
  checkCompatibility(this);
  return;
}

Assistant:

void checkCompatibility(const schema::Type::Reader& type,
                          const schema::Type::Reader& replacement,
                          UpgradeToStructMode upgradeToStructMode) {
    if (replacement.which() != type.which()) {
      // Check for allowed "upgrade" to Data or AnyPointer.
      if (replacement.isData() && canUpgradeToData(type)) {
        replacementIsNewer();
        return;
      } else if (type.isData() && canUpgradeToData(replacement)) {
        replacementIsOlder();
        return;
      } else if (replacement.isAnyPointer() && canUpgradeToAnyPointer(type)) {
        replacementIsNewer();
        return;
      } else if (type.isAnyPointer() && canUpgradeToAnyPointer(replacement)) {
        replacementIsOlder();
        return;
      }

      if (upgradeToStructMode == ALLOW_UPGRADE_TO_STRUCT) {
        if (type.isStruct()) {
          checkUpgradeToStruct(replacement, type.getStruct().getTypeId());
          return;
        } else if (replacement.isStruct()) {
          checkUpgradeToStruct(type, replacement.getStruct().getTypeId());
          return;
        }
      }

      FAIL_VALIDATE_SCHEMA("a type was changed");
    }

    switch (type.which()) {
      case schema::Type::VOID:
      case schema::Type::BOOL:
      case schema::Type::INT8:
      case schema::Type::INT16:
      case schema::Type::INT32:
      case schema::Type::INT64:
      case schema::Type::UINT8:
      case schema::Type::UINT16:
      case schema::Type::UINT32:
      case schema::Type::UINT64:
      case schema::Type::FLOAT32:
      case schema::Type::FLOAT64:
      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::ANY_POINTER:
        return;

      case schema::Type::LIST:
        checkCompatibility(type.getList().getElementType(), replacement.getList().getElementType(),
                           ALLOW_UPGRADE_TO_STRUCT);
        return;

      case schema::Type::ENUM:
        VALIDATE_SCHEMA(replacement.getEnum().getTypeId() == type.getEnum().getTypeId(),
                        "type changed enum type");
        return;

      case schema::Type::STRUCT:
        // TODO(someday):  If the IDs don't match, we should compare the two structs for
        //   compatibility.  This is tricky, though, because the new type's target may not yet be
        //   loaded.  In that case we could take the old type, make a copy of it, assign the new
        //   ID to the copy, and load() that.  That forces any struct type loaded for that ID to
        //   be compatible.  However, that has another problem, which is that it could be that the
        //   whole reason the type was replaced was to fork that type, and so an incompatibility
        //   could be very much expected.  This could be a rat hole...
        VALIDATE_SCHEMA(replacement.getStruct().getTypeId() == type.getStruct().getTypeId(),
                        "type changed to incompatible struct type");
        return;

      case schema::Type::INTERFACE:
        VALIDATE_SCHEMA(replacement.getInterface().getTypeId() == type.getInterface().getTypeId(),
                        "type changed to incompatible interface type");
        return;
    }

    // We assume unknown types (from newer versions of Cap'n Proto?) are equivalent.
  }